

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void EncodeContextMap(MemoryManager *m,uint32_t *context_map,size_t context_map_size,
                     size_t num_clusters,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  undefined1 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  void *p;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  size_t __n;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint32_t histogram [272];
  uint8_t depths [272];
  uint16_t bits [272];
  undefined4 local_7a8;
  byte local_368 [272];
  uint16_t local_258 [276];
  
  StoreVarLenUint8(num_clusters - 1,storage_ix,storage);
  if (num_clusters != 1) {
    p = BrotliAllocate(m,context_map_size * 4);
    uVar3 = *context_map;
    if (1 < context_map_size) {
      sVar5 = 1;
      do {
        if (uVar3 < context_map[sVar5]) {
          uVar3 = context_map[sVar5];
        }
        sVar5 = sVar5 + 1;
      } while (context_map_size != sVar5);
    }
    if (0xff < uVar3) {
      __assert_fail("max_value < 256u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                    ,0x26e,
                    "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)")
      ;
    }
    uVar13 = (ulong)(uVar3 + 1);
    uVar6 = 0;
    do {
      *(char *)((long)&local_7a8 + uVar6) = (char)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
    if (context_map_size == 0) {
      uVar3 = 0;
    }
    else {
      sVar5 = 0;
      do {
        sVar10 = 0;
        do {
          __n = sVar10;
          if (*(char *)((long)&local_7a8 + sVar10) == (char)context_map[sVar5]) break;
          sVar10 = sVar10 + 1;
          __n = uVar13;
        } while (uVar13 != sVar10);
        if (uVar13 <= __n) {
          __assert_fail("index < mtf_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                        ,0x276,
                        "void MoveToFrontTransform(const uint32_t *restrict, const size_t, uint32_t *)"
                       );
        }
        *(int *)((long)p + sVar5 * 4) = (int)__n;
        uVar1 = *(undefined1 *)((long)&local_7a8 + __n);
        if (__n != 0) {
          memmove((void *)((long)&local_7a8 + 1),&local_7a8,__n);
        }
        local_7a8._0_1_ = uVar1;
        sVar5 = sVar5 + 1;
      } while (sVar5 != context_map_size);
      uVar3 = 0;
      uVar6 = 0;
      do {
        uVar13 = uVar6 + 1;
        if (uVar6 + 1 < context_map_size) {
          uVar13 = context_map_size;
        }
        do {
          uVar8 = uVar6;
          if (*(int *)((long)p + uVar6 * 4) == 0) break;
          uVar6 = uVar6 + 1;
          uVar8 = uVar13;
        } while (uVar13 != uVar6);
        uVar6 = uVar8;
        uVar4 = 0;
        if (uVar8 < context_map_size) {
          iVar7 = (int)uVar8;
          uVar9 = 0;
          do {
            uVar6 = uVar8;
            uVar4 = uVar9;
            if (*(int *)((long)p + uVar8 * 4) != 0) break;
            uVar9 = uVar9 + 1;
            uVar8 = uVar8 + 1;
            uVar6 = context_map_size;
            uVar4 = (int)context_map_size - iVar7;
          } while (context_map_size != uVar8);
        }
        if (uVar3 < uVar4) {
          uVar3 = uVar4;
        }
      } while (uVar6 < context_map_size);
    }
    uVar4 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar9 = 6;
    if (uVar4 < 6) {
      uVar9 = uVar4;
    }
    if (uVar3 == 0) {
      uVar9 = 0;
    }
    if (context_map_size == 0) {
      uVar13 = 0;
    }
    else {
      uVar3 = 2 << ((byte)uVar9 & 0x1f);
      uVar13 = 0;
      uVar6 = 0;
      do {
        if (uVar6 < uVar13) {
          __assert_fail("*out_size <= i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                        ,0x296,
                        "void RunLengthCodeZeros(const size_t, uint32_t *restrict, size_t *restrict, uint32_t *restrict)"
                       );
        }
        iVar7 = *(int *)((long)p + uVar6 * 4);
        if (iVar7 == 0) {
          uVar8 = 1;
          if (uVar6 + 1 < context_map_size) {
            uVar8 = (ulong)(uint)((int)context_map_size - (int)uVar6);
            uVar11 = 1;
            do {
              if (*(int *)((long)p + uVar11 * 4 + uVar6 * 4) != 0) {
                uVar8 = uVar11 & 0xffffffff;
                break;
              }
              uVar11 = uVar11 + 1;
            } while (context_map_size - uVar6 != uVar11);
          }
          uVar11 = uVar8;
          if ((int)uVar8 != 0) {
LAB_00117195:
            uVar4 = (uint)uVar11;
            if (uVar3 <= uVar4) goto code_r0x00117199;
            uVar12 = 0x1f;
            if (uVar4 != 0) {
              for (; uVar4 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            uVar12 = ((-1 << ((byte)uVar12 & 0x1f)) + uVar4) * 0x200 | uVar12;
            goto LAB_00117142;
          }
        }
        else {
          uVar12 = iVar7 + uVar9;
          uVar8 = 1;
LAB_00117142:
          *(uint *)((long)p + uVar13 * 4) = uVar12;
          uVar13 = uVar13 + 1;
        }
LAB_00117149:
        uVar6 = uVar6 + uVar8;
      } while (uVar6 < context_map_size);
    }
    memset(&local_7a8,0,0x440);
    if (uVar13 != 0) {
      uVar6 = 0;
      do {
        (&local_7a8)[*(uint *)((long)p + uVar6 * 4) & 0x1ff] =
             (&local_7a8)[*(uint *)((long)p + uVar6 * 4) & 0x1ff] + 1;
        uVar6 = uVar6 + 1;
      } while (uVar13 != uVar6);
    }
    uVar8 = *storage_ix;
    uVar6 = uVar8 + 1;
    *(ulong *)(storage + (uVar8 >> 3)) =
         (ulong)(uVar9 != 0) << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar6;
    if (uVar9 != 0) {
      *(ulong *)(storage + (uVar6 >> 3)) =
           (ulong)(uVar9 - 1) << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
      *storage_ix = uVar8 + 5;
    }
    BuildAndStoreHuffmanTree
              (&local_7a8,uVar9 + num_clusters,tree,local_368,local_258,storage_ix,storage);
    if (uVar13 != 0) {
      uVar6 = 0;
      do {
        uVar3 = *(uint *)((long)p + uVar6 * 4);
        uVar4 = uVar3 & 0x1ff;
        bVar2 = local_368[uVar4];
        if (local_258[uVar4] >> (bVar2 & 0x3f) != 0) {
LAB_00117393:
          __assert_fail("(bits >> n_bits) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                        ,0x36,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        if (0x38 < bVar2) {
LAB_00117374:
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        uVar8 = *storage_ix;
        uVar11 = bVar2 + uVar8;
        *(ulong *)(storage + (uVar8 >> 3)) =
             (ulong)local_258[uVar4] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
        *storage_ix = uVar11;
        if (uVar4 - 1 < uVar9) {
          uVar3 = uVar3 >> 9;
          if (uVar3 >> ((byte)uVar4 & 0x3f) != 0) goto LAB_00117393;
          if (0x38 < uVar4) goto LAB_00117374;
          *(ulong *)(storage + (uVar11 >> 3)) =
               (ulong)uVar3 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = uVar4 + uVar11;
        }
        uVar6 = uVar6 + 1;
      } while (uVar13 != uVar6);
    }
    uVar6 = *storage_ix;
    *(ulong *)(storage + (uVar6 >> 3)) = (ulong)storage[uVar6 >> 3] | 1L << ((byte)uVar6 & 7);
    *storage_ix = uVar6 + 1;
    BrotliFree(m,p);
  }
  return;
code_r0x00117199:
  *(uint *)((long)p + uVar13 * 4) = ~(-1 << ((byte)uVar9 & 0x1f)) * 0x200 + uVar9;
  uVar13 = uVar13 + 1;
  uVar4 = (uVar4 - uVar3) + 1;
  uVar11 = (ulong)uVar4;
  if (uVar4 == 0) goto LAB_00117149;
  goto LAB_00117195;
}

Assistant:

static void EncodeContextMap(MemoryManager* m,
                             const uint32_t* context_map,
                             size_t context_map_size,
                             size_t num_clusters,
                             HuffmanTree* tree,
                             size_t* storage_ix, uint8_t* storage) {
  size_t i;
  uint32_t* rle_symbols;
  uint32_t max_run_length_prefix = 6;
  size_t num_rle_symbols = 0;
  uint32_t histogram[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  static const uint32_t kSymbolMask = (1u << SYMBOL_BITS) - 1u;
  uint8_t depths[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];
  uint16_t bits[BROTLI_MAX_CONTEXT_MAP_SYMBOLS];

  StoreVarLenUint8(num_clusters - 1, storage_ix, storage);

  if (num_clusters == 1) {
    return;
  }

  rle_symbols = BROTLI_ALLOC(m, uint32_t, context_map_size);
  if (BROTLI_IS_OOM(m)) return;
  MoveToFrontTransform(context_map, context_map_size, rle_symbols);
  RunLengthCodeZeros(context_map_size, rle_symbols,
                     &num_rle_symbols, &max_run_length_prefix);
  memset(histogram, 0, sizeof(histogram));
  for (i = 0; i < num_rle_symbols; ++i) {
    ++histogram[rle_symbols[i] & kSymbolMask];
  }
  {
    BROTLI_BOOL use_rle = TO_BROTLI_BOOL(max_run_length_prefix > 0);
    BrotliWriteBits(1, (uint64_t)use_rle, storage_ix, storage);
    if (use_rle) {
      BrotliWriteBits(4, max_run_length_prefix - 1, storage_ix, storage);
    }
  }
  BuildAndStoreHuffmanTree(histogram, num_clusters + max_run_length_prefix,
                           tree, depths, bits, storage_ix, storage);
  for (i = 0; i < num_rle_symbols; ++i) {
    const uint32_t rle_symbol = rle_symbols[i] & kSymbolMask;
    const uint32_t extra_bits_val = rle_symbols[i] >> SYMBOL_BITS;
    BrotliWriteBits(depths[rle_symbol], bits[rle_symbol], storage_ix, storage);
    if (rle_symbol > 0 && rle_symbol <= max_run_length_prefix) {
      BrotliWriteBits(rle_symbol, extra_bits_val, storage_ix, storage);
    }
  }
  BrotliWriteBits(1, 1, storage_ix, storage);  /* use move-to-front */
  BROTLI_FREE(m, rle_symbols);
}